

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

void av1_row_mt_sync_read(AV1EncRowMultiThreadSync *row_mt_sync,int r,int c)

{
  long lVar1;
  int iVar2;
  int iVar3;
  pthread_mutex_t *__mutex;
  
  if (r != 0) {
    iVar2 = row_mt_sync->sync_range;
    lVar1 = (long)r + -1;
    __mutex = row_mt_sync->mutex_ + lVar1;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    iVar3 = row_mt_sync->num_finished_cols[(long)r + -1] -
            (row_mt_sync->intrabc_extra_top_right_sb_delay + iVar2);
    while (iVar3 < c) {
      pthread_cond_wait((pthread_cond_t *)(row_mt_sync->cond_ + lVar1),(pthread_mutex_t *)__mutex);
      iVar3 = row_mt_sync->num_finished_cols[lVar1] -
              (row_mt_sync->intrabc_extra_top_right_sb_delay + iVar2);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  return;
}

Assistant:

void av1_row_mt_sync_read(AV1EncRowMultiThreadSync *row_mt_sync, int r, int c) {
#if CONFIG_MULTITHREAD
  const int nsync = row_mt_sync->sync_range;

  if (r) {
    pthread_mutex_t *const mutex = &row_mt_sync->mutex_[r - 1];
    pthread_mutex_lock(mutex);

    while (c > row_mt_sync->num_finished_cols[r - 1] - nsync -
                   row_mt_sync->intrabc_extra_top_right_sb_delay) {
      pthread_cond_wait(&row_mt_sync->cond_[r - 1], mutex);
    }
    pthread_mutex_unlock(mutex);
  }
#else
  (void)row_mt_sync;
  (void)r;
  (void)c;
#endif  // CONFIG_MULTITHREAD
}